

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O3

void __thiscall
de::Random::choose<char_const*,char*>(Random *this,char *first,char *last,char *result,int numItems)

{
  deUint32 dVar1;
  uint uVar2;
  int iVar3;
  
  if (first != last) {
    iVar3 = 0;
    do {
      if (iVar3 < numItems) {
        result[iVar3] = *first;
      }
      else {
        dVar1 = deRandom_getUint32(&this->m_rnd);
        uVar2 = dVar1 % (iVar3 + 1U);
        if ((int)uVar2 < numItems) {
          result[(int)uVar2] = *first;
        }
      }
      iVar3 = iVar3 + 1;
      first = first + 1;
    } while (first != last);
  }
  return;
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}